

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

int tree_print_aug_target(lyout *out,int line_printed,uint8_t indent,char *path,tp_opts *opts)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  undefined7 in_register_00000011;
  char *__s;
  char *pcVar5;
  uint uVar6;
  
  uVar1 = line_printed + 2;
  __s = (char *)CONCAT71(in_register_00000011,indent);
  do {
    pcVar3 = strchr(__s + 1,0x2f);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(__s);
      uVar6 = (int)sVar4 + 1;
    }
    else {
      uVar6 = (int)pcVar3 - (int)__s;
    }
    if (((__s != (char *)CONCAT71(in_register_00000011,indent)) && (*(ushort *)(path + 0x18) != 0))
       && ((int)(uint)*(ushort *)(path + 0x18) < (int)(uVar6 + line_printed))) {
      iVar2 = ly_print(out,"\n%*s",(ulong)uVar1,"");
      line_printed = iVar2 + -1;
    }
    pcVar5 = "";
    if (pcVar3 == (char *)0x0) {
      pcVar5 = ":";
    }
    iVar2 = ly_print(out,"%.*s%s",(ulong)uVar6,__s,pcVar5);
    line_printed = line_printed + iVar2;
    __s = pcVar3;
  } while (pcVar3 != (char *)0x0);
  return iVar2;
}

Assistant:

static int
tree_print_aug_target(struct lyout *out, int line_printed, uint8_t indent, const char *path, tp_opts *opts)
{
    int printed, is_last, len;
    const char *cur, *next;

    printed = line_printed;
    cur = path;
    do {
        next = strchr(cur + 1, '/');
        if (!next) {
            len = strlen(cur) + 1;
            is_last = 1;
        } else {
            len = next - cur;
            is_last = 0;
        }

        if (opts->line_length && cur != path && (printed + len > opts->line_length)) {
            /* line_printed is treated as the base indent */
            printed = ly_print(out, "\n%*s", line_printed + indent, "");
            /* minus the newline */
            --printed;
        }
        printed += ly_print(out, "%.*s%s", len, cur, is_last ? ":" : "");

        cur = next;
    } while (!is_last);

    return printed;
}